

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_light.cpp
# Opt level: O2

double __thiscall ON_Light::HotSpot(ON_Light *this)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar4 = this->m_hotspot;
  if ((dVar4 < 0.0) || (1.0 < dVar4)) {
    dVar2 = this->m_spot_exponent;
    dVar4 = 0.0;
    if ((dVar2 < 65536.0) &&
       ((((dVar4 = 1.0, 0.0 < dVar2 && (0.0 < this->m_spot_angle)) && (this->m_spot_angle <= 90.0))
        && (-690.0 <= log_hotspot_min / dVar2)))) {
      dVar2 = exp(log_hotspot_min / dVar2);
      bVar1 = ON_IsValid(dVar2);
      dVar4 = 0.0;
      if (((bVar1) && (dVar4 = 1.0, dVar2 <= 1.0)) && (dVar4 = dVar2, dVar2 < -1.0)) {
        dVar4 = -1.0;
      }
      dVar2 = this->m_spot_angle;
      dVar3 = acos(dVar4);
      dVar3 = dVar3 / ((dVar2 * 3.141592653589793) / 180.0);
      dVar4 = 0.0;
      if ((0.0 <= dVar3) && (dVar4 = dVar3, 1.0 < dVar3)) {
        dVar4 = 1.0;
      }
    }
  }
  return dVar4;
}

Assistant:

double ON_Light::HotSpot() const
{
  double h = m_hotspot;
  if ( h < 0.0 || h > 1.0 ) {
    // spotlight is using spot exponent interface
    if ( m_spot_exponent >= 65536.0 )
      h = 0.0;
    else if ( m_spot_exponent <= 0.0 || m_spot_angle <= 0.0 || m_spot_angle > 90.0 )
      h = 1.0;
    else {
      // compute HotSpot() from cos(h*angle)^e = hotspot_min
      double x, a, cos_ha;
      x = log_hotspot_min/m_spot_exponent; // note that x < 0.0
      if ( x < -690.0 ) {
        // prevent underflow.  cos_ha is close to zero so
        h = 1.0;
      }
      else 
      {
        cos_ha = exp(x);
        if (!ON_IsValid(cos_ha))  cos_ha =  0.0;
        else if ( cos_ha >  1.0 ) cos_ha =  1.0;
        else if ( cos_ha < -1.0 ) cos_ha = -1.0;
        a = SpotAngleRadians();
        h = acos(cos_ha)/a;
        if ( h < 0.0 )
          h = 0.0;
        else if ( h > 1.0 ) {
          // happens for smaller e
          h = 1.0;
        }
      }
    }
  }
  return h;
}